

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayout::clear(QDockAreaLayout *this)

{
  long lVar1;
  QRect *in_RDI;
  long in_FS_OFFSET;
  int i;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffb8;
  int local_34;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    QDockAreaLayoutInfo::clear(in_stack_ffffffffffffffb8);
  }
  QRect::QRect(in_RDI);
  in_RDI[1].x1 = (Representation)(undefined4)local_18;
  in_RDI[1].y1 = (Representation)local_18._4_4_;
  in_RDI[1].x2 = (Representation)(undefined4)uStack_10;
  in_RDI[1].y2 = (Representation)uStack_10._4_4_;
  QRect::QRect(in_RDI);
  in_RDI[3].x1.m_i = local_28;
  in_RDI[3].y1.m_i = iStack_24;
  in_RDI[3].x2.m_i = iStack_20;
  in_RDI[3].y2.m_i = iStack_1c;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::clear()
{
    for (int i = 0; i < QInternal::DockCount; ++i)
        docks[i].clear();

    rect = QRect();
    centralWidgetRect = QRect();
}